

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O3

string * soul::trimCharacterAtStart(string *__return_storage_ptr__,string *s,char charToRemove)

{
  char *pcVar1;
  size_type sVar2;
  char *pcVar3;
  
  sVar2 = s->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (s->_M_dataplus)._M_p;
    pcVar1 = pcVar3 + sVar2;
    do {
      if (*pcVar3 != charToRemove) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)__return_storage_ptr__,pcVar3,pcVar1);
        return __return_storage_ptr__;
      }
      pcVar3 = pcVar3 + 1;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string trimCharacterAtStart (const std::string& s, char charToRemove)
{
    for (auto c = s.begin(); c != s.end(); ++c)
        if (*c != charToRemove)
            return { c, s.end() };

    return {};
}